

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

void Sbd_ManUpdateOrder(Sbd_Man_t *p,int Pivot)

{
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int local_2c;
  int LevelMax;
  int nTimeValidDivs;
  Vec_Int_t *vLevel;
  int Node;
  int k;
  int i;
  int Pivot_local;
  Sbd_Man_t *p_local;
  
  local_2c = 0;
  iVar1 = Vec_IntEntry(p->vLutLevs,Pivot);
  Vec_WecClear(p->vDivLevels);
  Vec_WecInit(p->vDivLevels,iVar1 + 1);
  for (Node = 0; iVar2 = Vec_IntSize(p->vWinObjs), Node < iVar2; Node = Node + 1) {
    iVar2 = Vec_IntEntry(p->vWinObjs,Node);
    p_00 = p->vDivLevels;
    iVar3 = Vec_IntEntry(p->vLutLevs,iVar2);
    Vec_WecPush(p_00,iVar3,iVar2);
  }
  Vec_IntClear(p->vWinObjs);
  for (Node = 0; iVar2 = Vec_WecSize(p->vDivLevels), Node < iVar2; Node = Node + 1) {
    pVVar4 = Vec_WecEntry(p->vDivLevels,Node);
    Vec_IntSort(pVVar4,0);
    for (vLevel._4_4_ = 0; iVar2 = Vec_IntSize(pVVar4), vLevel._4_4_ < iVar2;
        vLevel._4_4_ = vLevel._4_4_ + 1) {
      iVar2 = Vec_IntEntry(pVVar4,vLevel._4_4_);
      p_01 = p->vObj2Var;
      iVar3 = Vec_IntSize(p->vWinObjs);
      Vec_IntWriteEntry(p_01,iVar2,iVar3);
      Vec_IntPush(p->vWinObjs,iVar2);
    }
    if (Node == iVar1 + -2) {
      local_2c = Vec_IntSize(p->vWinObjs);
    }
  }
  if (local_2c < 1) {
    __assert_fail("nTimeValidDivs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x16d,"void Sbd_ManUpdateOrder(Sbd_Man_t *, int)");
  }
  Vec_IntClear(p->vDivVars);
  p->DivCutoff = -1;
  for (Node = Abc_MaxInt(0,local_2c + -0x3f); Node < local_2c; Node = Node + 1) {
    iVar2 = Vec_IntEntry(p->vWinObjs,Node);
    if ((p->DivCutoff == -1) && (iVar2 = Vec_IntEntry(p->vLutLevs,iVar2), iVar2 == iVar1 + -2)) {
      iVar2 = Vec_IntSize(p->vDivVars);
      p->DivCutoff = iVar2;
    }
    Vec_IntPush(p->vDivVars,Node);
  }
  if (p->DivCutoff == -1) {
    p->DivCutoff = 0;
  }
  pVVar4 = p->vDivValues;
  iVar1 = Vec_IntSize(p->vDivVars);
  Vec_IntFill(pVVar4,iVar1,0);
  return;
}

Assistant:

void Sbd_ManUpdateOrder( Sbd_Man_t * p, int Pivot )
{
    int i, k, Node;
    Vec_Int_t * vLevel;
    int nTimeValidDivs = 0;
    // collect divisors by logic level
    int LevelMax = Vec_IntEntry(p->vLutLevs, Pivot);
    Vec_WecClear( p->vDivLevels );
    Vec_WecInit( p->vDivLevels, LevelMax + 1 );
    Vec_IntForEachEntry( p->vWinObjs, Node, i )
        Vec_WecPush( p->vDivLevels, Vec_IntEntry(p->vLutLevs, Node), Node );
    // reload divisors
    Vec_IntClear( p->vWinObjs );
    Vec_WecForEachLevel( p->vDivLevels, vLevel, i )
    {
        Vec_IntSort( vLevel, 0 );
        Vec_IntForEachEntry( vLevel, Node, k )
        {
            Vec_IntWriteEntry( p->vObj2Var, Node, Vec_IntSize(p->vWinObjs) );
            Vec_IntPush( p->vWinObjs, Node );
        }
        // remember divisor cutoff
        if ( i == LevelMax - 2 )
            nTimeValidDivs = Vec_IntSize(p->vWinObjs);
    }
    assert( nTimeValidDivs > 0 );
    Vec_IntClear( p->vDivVars );
    p->DivCutoff = -1;
    Vec_IntForEachEntryStartStop( p->vWinObjs, Node, i, Abc_MaxInt(0, nTimeValidDivs-63), nTimeValidDivs )
    {
        if ( p->DivCutoff == -1 && Vec_IntEntry(p->vLutLevs, Node) == LevelMax - 2 )
            p->DivCutoff = Vec_IntSize(p->vDivVars);
        Vec_IntPush( p->vDivVars, i );
    }
    if ( p->DivCutoff == -1 )
        p->DivCutoff = 0;
    // verify
/*
    assert( Vec_IntSize(p->vDivVars) < 64 );
    Vec_IntForEachEntryStart( p->vDivVars, Node, i, p->DivCutoff )
        assert( Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Node)) == LevelMax - 2 );
    Vec_IntForEachEntryStop( p->vDivVars, Node, i, p->DivCutoff )
        assert( Vec_IntEntry(p->vLutLevs, Vec_IntEntry(p->vWinObjs, Node)) < LevelMax - 2 );
*/
    Vec_IntFill( p->vDivValues, Vec_IntSize(p->vDivVars), 0 );
    //printf( "%d ", Vec_IntSize(p->vDivVars) );
//    printf( "Node %4d :  Win = %5d.   Divs = %5d.    D1 = %5d.  D2 = %5d.\n",  
//        Pivot, Vec_IntSize(p->vWinObjs), Vec_IntSize(p->vDivVars), Vec_IntSize(p->vDivVars)-p->DivCutoff, p->DivCutoff );
}